

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::Parser::parse_block(Parser *this)

{
  Token *pTVar1;
  char cVar2;
  int iVar3;
  ParserException *pPVar4;
  string *in_RSI;
  Limiter *local_f0;
  Limiter *local_b0;
  allocator local_81;
  string local_80;
  Token *local_60;
  Token *close_bracket;
  allocator local_41;
  string local_40;
  Token *local_20;
  Token *open_bracket;
  Parser *this_local;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *block;
  
  this_local = this;
  local_20 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
  if ((local_20 != (Token *)0x0) && (iVar3 = (*local_20->_vptr_Token[2])(), iVar3 == 1)) {
    if (local_20 == (Token *)0x0) {
      local_b0 = (Limiter *)0x0;
    }
    else {
      local_b0 = (Limiter *)
                 __dynamic_cast(local_20,&lexer::token::Token::typeinfo,
                                &lexer::token::Limiter::typeinfo,0);
    }
    cVar2 = lexer::token::Limiter::get_limiter(local_b0);
    if (cVar2 == '{') {
      close_bracket._2_1_ = 0;
      parse_implicit_block(this);
      local_60 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
      if ((local_60 != (Token *)0x0) && (iVar3 = (*local_60->_vptr_Token[2])(), iVar3 == 1)) {
        if (local_60 == (Token *)0x0) {
          local_f0 = (Limiter *)0x0;
        }
        else {
          local_f0 = (Limiter *)
                     __dynamic_cast(local_60,&lexer::token::Token::typeinfo,
                                    &lexer::token::Limiter::typeinfo,0);
        }
        cVar2 = lexer::token::Limiter::get_limiter(local_f0);
        if (cVar2 == '}') {
          return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
                  )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
                    )this;
        }
      }
      pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
      pTVar1 = local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"Expected close bracket }, but could not find one.",&local_81);
      exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_80);
      __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                  exception::ParserException::~ParserException);
    }
  }
  close_bracket._3_1_ = 1;
  pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
  pTVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,"Expected open bracket {, but could not find one.",&local_41);
  exception::ParserException::ParserException(pPVar4,pTVar1,in_RSI,&local_40);
  close_bracket._3_1_ = 0;
  __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
              exception::ParserException::~ParserException);
}

Assistant:

std::unique_ptr<Block> ninx::parser::Parser::parse_block() {
    Token *open_bracket{reader.get_token()};
    if (!open_bracket || open_bracket->get_type() != Type::LIMITER ||
        dynamic_cast<ninx::lexer::token::Limiter *>(open_bracket)->get_limiter() != '{') {
        throw ParserException(open_bracket, this->origin, "Expected open bracket {, but could not find one.");
    }

    auto block{parse_implicit_block()};

    Token *close_bracket{reader.get_token()};
    if (!close_bracket || close_bracket->get_type() != Type::LIMITER ||
        dynamic_cast<ninx::lexer::token::Limiter *>(close_bracket)->get_limiter() != '}') {
        throw ParserException(close_bracket, this->origin, "Expected close bracket }, but could not find one.");
    }

    return block;
}